

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbackingstore.cpp
# Opt level: O0

void __thiscall QBackingStore::endPaint(QBackingStore *this)

{
  long lVar1;
  bool bVar2;
  QPaintDevice *this_00;
  QPlatformBackingStore *pQVar3;
  char *in_RDI;
  long in_FS_OFFSET;
  char *pcVar4;
  QBackingStore *in_stack_ffffffffffffffd8;
  QMessageLogger *in_stack_ffffffffffffffe0;
  int line;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = in_RDI;
  this_00 = paintDevice(in_stack_ffffffffffffffd8);
  line = (int)((ulong)pcVar4 >> 0x20);
  bVar2 = QPaintDevice::paintingActive(this_00);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,line,in_RDI);
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,
               "QBackingStore::endPaint() called with active painter; did you forget to destroy it or call QPainter::end() on it?"
              );
  }
  pQVar3 = handle((QBackingStore *)in_stack_ffffffffffffffe0);
  (*pQVar3->_vptr_QPlatformBackingStore[0xb])();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QBackingStore::endPaint()
{
    if (paintDevice()->paintingActive())
        qWarning("QBackingStore::endPaint() called with active painter; did you forget to destroy it or call QPainter::end() on it?");

    handle()->endPaint();
}